

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Error * ot::commissioner::NetworkDataFromJson
                  (Error *__return_storage_ptr__,NetworkData *aNetworkData,string *aJson)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  bStack_2f8;
  string local_2e8;
  input_adapter local_2c8;
  _Any_data local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  NetworkData local_290;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  StripComments(&local_2e8,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2c8,&local_2e8);
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&bStack_2f8,&local_2c8,(parser_callback_t *)&local_2b8,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get<ot::commissioner::NetworkData,_ot::commissioner::NetworkData,_0>(&local_290,&bStack_2f8);
  NetworkData::operator=(aNetworkData,&local_290);
  NetworkData::~NetworkData(&local_290);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&bStack_2f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

Error NetworkDataFromJson(NetworkData &aNetworkData, const std::string &aJson)
{
    Error error;

    try
    {
        aNetworkData = Json::parse(StripComments(aJson));
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}